

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::convert_half_to_string_abi_cxx11_
          (CompilerGLSL *this,SPIRConstant *c,uint32_t col,uint32_t row)

{
  uint uVar1;
  CompilerError *this_00;
  undefined4 in_register_00000014;
  uint32_t in_R8D;
  float t;
  float fVar2;
  spirv_cross local_428 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_408 [32];
  spirv_cross local_3e8 [32];
  undefined1 local_3c8 [8];
  SPIRType type_1;
  string local_270 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [32];
  spirv_cross local_230 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [32];
  spirv_cross local_1f0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0 [32];
  spirv_cross local_1b0 [32];
  undefined1 local_190 [8];
  SPIRType type;
  float float_value;
  uint32_t row_local;
  uint32_t col_local;
  SPIRConstant *c_local;
  CompilerGLSL *this_local;
  string *res;
  
  ::std::__cxx11::string::string((string *)this);
  t = SPIRConstant::scalar_f16((SPIRConstant *)CONCAT44(in_register_00000014,col),row,in_R8D);
  uVar1 = ::std::isnan((double)(ulong)(uint)t);
  if (((uVar1 & 1) == 0) && (uVar1 = ::std::isinf((double)(ulong)(uint)t), (uVar1 & 1) == 0)) {
    SPIRType::SPIRType((SPIRType *)local_3c8);
    type_1.super_IVariant._vptr_IVariant._4_4_ = 0xc;
    type_1.super_IVariant._12_4_ = 1;
    type_1.width = 1;
    (*(c->super_IVariant)._vptr_IVariant[0x13])(local_408,c,local_3c8,0);
    convert_to_string_abi_cxx11_(local_428,t,c[0x1a].subconstants.stack_storage.aligned_char[0]);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (local_3e8,local_408,(char (*) [2])0x5cba12,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428,
               (char (*) [2])0x5b48c4);
    ::std::__cxx11::string::operator=((string *)this,(string *)local_3e8);
    ::std::__cxx11::string::~string((string *)local_3e8);
    ::std::__cxx11::string::~string((string *)local_428);
    ::std::__cxx11::string::~string((string *)local_408);
    SPIRType::~SPIRType((SPIRType *)local_3c8);
  }
  else {
    SPIRType::SPIRType((SPIRType *)local_190);
    type.super_IVariant._vptr_IVariant._4_4_ = 0xc;
    type.super_IVariant._12_4_ = 1;
    type.width = 1;
    fVar2 = ::std::numeric_limits<float>::infinity();
    if ((t != fVar2) || (NAN(t) || NAN(fVar2))) {
      fVar2 = ::std::numeric_limits<float>::infinity();
      if ((t != -fVar2) || (NAN(t) || NAN(-fVar2))) {
        uVar1 = ::std::isnan((double)(ulong)(uint)t);
        if ((uVar1 & 1) == 0) {
          type_1.member_name_cache._M_h._M_single_bucket._6_1_ = 1;
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string
                    (local_270,"Cannot represent non-finite floating point constant.",
                     (allocator *)((long)&type_1.member_name_cache._M_h._M_single_bucket + 7));
          CompilerError::CompilerError(this_00,(string *)local_270);
          type_1.member_name_cache._M_h._M_single_bucket._6_1_ = 0;
          __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        (*(c->super_IVariant)._vptr_IVariant[0x13])(local_250,c,local_190,0);
        join<std::__cxx11::string,char_const(&)[12]>
                  (local_230,local_250,(char (*) [12])"(0.0 / 0.0)");
        ::std::__cxx11::string::operator=((string *)this,(string *)local_230);
        ::std::__cxx11::string::~string((string *)local_230);
        ::std::__cxx11::string::~string((string *)local_250);
      }
      else {
        (*(c->super_IVariant)._vptr_IVariant[0x13])(local_210,c,local_190,0);
        join<std::__cxx11::string,char_const(&)[13]>
                  (local_1f0,local_210,(char (*) [13])"(-1.0 / 0.0)");
        ::std::__cxx11::string::operator=((string *)this,(string *)local_1f0);
        ::std::__cxx11::string::~string((string *)local_1f0);
        ::std::__cxx11::string::~string((string *)local_210);
      }
    }
    else {
      (*(c->super_IVariant)._vptr_IVariant[0x13])(local_1d0,c,local_190,0);
      join<std::__cxx11::string,char_const(&)[12]>(local_1b0,local_1d0,(char (*) [12])"(1.0 / 0.0)")
      ;
      ::std::__cxx11::string::operator=((string *)this,(string *)local_1b0);
      ::std::__cxx11::string::~string((string *)local_1b0);
      ::std::__cxx11::string::~string((string *)local_1d0);
    }
    SPIRType::~SPIRType((SPIRType *)local_190);
  }
  return this;
}

Assistant:

string CompilerGLSL::convert_half_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	float float_value = c.scalar_f16(col, row);

	// There is no literal "hf" in GL_NV_gpu_shader5, so to avoid lots
	// of complicated workarounds, just value-cast to the half type always.
	if (std::isnan(float_value) || std::isinf(float_value))
	{
		SPIRType type;
		type.basetype = SPIRType::Half;
		type.vecsize = 1;
		type.columns = 1;

		if (float_value == numeric_limits<float>::infinity())
			res = join(type_to_glsl(type), "(1.0 / 0.0)");
		else if (float_value == -numeric_limits<float>::infinity())
			res = join(type_to_glsl(type), "(-1.0 / 0.0)");
		else if (std::isnan(float_value))
			res = join(type_to_glsl(type), "(0.0 / 0.0)");
		else
			SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
	}
	else
	{
		SPIRType type;
		type.basetype = SPIRType::Half;
		type.vecsize = 1;
		type.columns = 1;
		res = join(type_to_glsl(type), "(", convert_to_string(float_value, current_locale_radix_character), ")");
	}

	return res;
}